

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

void __thiscall
nv::FloatImage::scaleBias(FloatImage *this,uint base_component,uint num,float scale,float bias)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (num != 0) {
    uVar2 = (uint)this->m_height * (uint)this->m_width;
    pfVar1 = this->m_mem;
    uVar3 = base_component * this->m_height * (uint)this->m_width;
    uVar4 = 0;
    do {
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          pfVar1[uVar3 + uVar5] = (pfVar1[uVar3 + uVar5] + bias) * scale;
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + uVar2;
    } while (uVar4 != num);
  }
  return;
}

Assistant:

void FloatImage::scaleBias(uint base_component, uint num, float scale, float bias)
{
	const uint size = m_width * m_height;
	
	for(uint c = 0; c < num; c++) {
		float * ptr = this->channel(base_component + c);
		
		for(uint i = 0; i < size; i++) {
			ptr[i] = scale * (ptr[i] + bias);
		}
	}
}